

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

Builder * __thiscall
capnp::anon_unknown_0::MembraneCapTableBuilder::imbue
          (Builder *__return_storage_ptr__,MembraneCapTableBuilder *this,Builder builder)

{
  PointerBuilder builder_00;
  bool bVar1;
  Builder *builder_01;
  CapTableBuilder *pCVar2;
  PointerBuilder local_90;
  undefined1 local_78 [8];
  PointerBuilder pointerBuilder;
  Fault local_50;
  Fault f;
  CapTableBuilder **local_40;
  undefined1 local_38 [8];
  DebugComparison<capnp::_::CapTableBuilder_*&,_std::nullptr_t> _kjCondition;
  MembraneCapTableBuilder *this_local;
  
  _kjCondition._32_8_ = this;
  local_40 = (CapTableBuilder **)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->inner);
  f.exception = (Exception *)0x0;
  kj::_::DebugExpression<capnp::_::CapTableBuilder*&>::operator==
            ((DebugComparison<capnp::_::CapTableBuilder_*&,_std::nullptr_t> *)local_38,
             (DebugExpression<capnp::_::CapTableBuilder*&> *)&local_40,&f.exception);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::CapTableBuilder*&,decltype(nullptr)>&,char_const(&)[24]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
               ,0x52,FAILED,"inner == nullptr","_kjCondition,\"can only call this once\"",
               (DebugComparison<capnp::_::CapTableBuilder_*&,_std::nullptr_t> *)local_38,
               (char (*) [24])"can only call this once");
    kj::_::Debug::Fault::fatal(&local_50);
  }
  builder_01 = kj::mv<capnp::AnyPointer::Builder>(&builder);
  capnp::_::PointerHelpers<capnp::AnyPointer,_(capnp::Kind)7>::getInternalBuilder
            ((PointerBuilder *)local_78,builder_01);
  pCVar2 = capnp::_::PointerBuilder::getCapTable((PointerBuilder *)local_78);
  this->inner = pCVar2;
  capnp::_::PointerBuilder::imbue(&local_90,(PointerBuilder *)local_78,&this->super_CapTableBuilder)
  ;
  builder_00.capTable = local_90.capTable;
  builder_00.segment = local_90.segment;
  builder_00.pointer = local_90.pointer;
  AnyPointer::Builder::Builder(__return_storage_ptr__,builder_00);
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Builder imbue(AnyPointer::Builder builder) {
    KJ_REQUIRE(inner == nullptr, "can only call this once");
    auto pointerBuilder = _::PointerHelpers<AnyPointer>::getInternalBuilder(kj::mv(builder));
    inner = pointerBuilder.getCapTable();
    return AnyPointer::Builder(pointerBuilder.imbue(this));
  }